

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O1

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::insert
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,size_t index,utf32_t x,
          size_t count)

{
  undefined8 in_RAX;
  C *pCVar1;
  C *dst;
  C *pCVar2;
  size_t length;
  size_t sVar3;
  size_t size;
  C pattern [4];
  byte local_34 [4];
  
  local_34[0] = (byte)((ulong)in_RAX >> 0x20);
  sVar3 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  if (count != 0) {
    pCVar1 = enc::Utf8Encoder::encode((C *)local_34,x,0xfffd);
    size = (long)pCVar1 - (long)local_34;
    length = size * count;
    dst = insertSpace(this,index,length);
    if (dst == (C *)0x0) {
      sVar3 = 0xffffffffffffffff;
    }
    else {
      if (size == 1) {
        memset(dst,(uint)local_34[0],count);
      }
      else if (0 < (long)length) {
        pCVar2 = dst + length;
        do {
          __wrap_memcpy(dst,local_34,size);
          dst = dst + size;
        } while (dst < pCVar2);
      }
      sVar3 = length + sVar3;
    }
  }
  return sVar3;
}

Assistant:

size_t
	insert(
		size_t index,
		utf32_t x,
		size_t count
	) {
		size_t oldLength = this->m_length;

		if (count == 0)
			return oldLength;

		C pattern[sizeof(utf32_t) / sizeof(C)];
		C* end = Encoding::Encoder::encode(pattern, x);
		size_t codePointLength = end - pattern;
		ASSERT(codePointLength <= countof(pattern));

		size_t insertLength = count * codePointLength;
		C* dst = insertSpace(index, count * codePointLength);
		if (!dst)
			return -1;

		fillWithPattern(dst, pattern, codePointLength, count);
		return oldLength + insertLength;
	}